

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cones.h
# Opt level: O1

ConeArgs * __thiscall
mp::
Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::CheckNorm2_Pow<mp::ConstraintLocationHelper<mp::BasicConstraintKeeper>>
          (ConeArgs *__return_storage_ptr__,void *this,
          ConstraintLocationHelper<mp::BasicConstraintKeeper> *ci,int res_var)

{
  QuadTerms *this_00;
  int *piVar1;
  int iVar2;
  ptr ppVar3;
  double *pdVar4;
  long lVar5;
  reference pCVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  double *c;
  double *pdVar12;
  double dVar13;
  ArrayRef<double> local_78;
  QuadTerms *local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  pCVar6 = std::
           _Deque_iterator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>::Container,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>::Container_&,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>::Container_*>
           ::operator[]((_Deque_iterator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>::Container,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>::Container_&,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>::Container_*>
                         *)(*this + 0x4528),(long)ci->index_);
  dVar13 = (pCVar6->con_).con_flat_.
           super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>
           .params_._M_elems[0];
  if ((dVar13 == 0.5) && (!NAN(dVar13))) {
    iVar2 = (pCVar6->con_).con_flat_.
            super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>
            .args_._M_elems[0];
    lVar11 = *this;
    lVar7 = *(long *)(lVar11 + 0x2b0);
    uVar8 = *(long *)(lVar11 + 0x2b8) - lVar7;
    if (iVar2 < (int)(uVar8 >> 4)) {
      lVar10 = (long)iVar2 * 0x10;
      if (*(long *)(lVar7 + lVar10) != 0) {
        if ((ulong)((long)uVar8 >> 4) <= (ulong)(long)iVar2) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        if (lVar11 + 0x17e0 == *(long *)(lVar7 + lVar10)) {
          lVar7 = (long)*(int *)(lVar7 + lVar10 + 8);
          lVar10 = (*(long *)(lVar11 + 0x18c0) - *(long *)(lVar11 + 0x18c8) >> 3) *
                   -0x1041041041041041 + lVar7;
          if (lVar10 == 0) {
            lVar11 = *(long *)(lVar11 + 0x18c0) + lVar7 * 0x1f8;
          }
          else {
            lVar11 = *(long *)(*(long *)(lVar11 + 0x18d8) + lVar10 * 8);
          }
          if ((0.0 <= *(double *)(lVar11 + 0x1e0)) && (*(long *)(lVar11 + 0x38) == 0)) {
            this_00 = (QuadTerms *)(lVar11 + 0xa0);
            lVar10 = *(long *)(lVar11 + 0xb0);
            lVar7 = lVar10 + 1;
            lVar9 = lVar10 << 0x20;
            lVar10 = lVar10 * 0x10 + -0xc;
            do {
              lVar9 = lVar9 + -0x100000000;
              lVar7 = lVar7 + -1;
              if (lVar7 == 0) {
                __return_storage_ptr__->is_from_abs_ = false;
                (__return_storage_ptr__->coefs_).super__Vector_base<double,_std::allocator<double>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                (__return_storage_ptr__->coefs_).super__Vector_base<double,_std::allocator<double>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                (__return_storage_ptr__->coefs_).super__Vector_base<double,_std::allocator<double>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                (__return_storage_ptr__->vars_).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                (__return_storage_ptr__->vars_).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                (__return_storage_ptr__->vars_).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                __return_storage_ptr__->const_term = 0.0;
                __return_storage_ptr__->coef_extra = 0.0;
                (__return_storage_ptr__->res_vars_to_delete_).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start = (pointer)0x0;
                (__return_storage_ptr__->res_vars_to_delete_).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish = (pointer)0x0;
                (__return_storage_ptr__->res_vars_to_delete_).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage = (pointer)0x0;
                QuadTerms::unfold_if_need(this_00);
                local_78.data_ = *(double **)(lVar11 + 0x138);
                local_78.size_ = *(size_t *)(lVar11 + 0x148);
                local_78.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_78.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_78.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                ArrayRef<double>::move_or_copy(&local_48,&local_78);
                std::vector<double,_std::allocator<double>_>::_M_move_assign
                          (&__return_storage_ptr__->coefs_,&local_48);
                if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_48.super__Vector_base<double,_std::allocator<double>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_48.super__Vector_base<double,_std::allocator<double>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                local_50 = this_00;
                if (local_78.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_78.save_.super__Vector_base<double,_std::allocator<double>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_78.save_.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage -
                                  (long)local_78.save_.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start);
                }
                pdVar4 = (__return_storage_ptr__->coefs_).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                for (pdVar12 = (__return_storage_ptr__->coefs_).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start; pdVar12 != pdVar4;
                    pdVar12 = pdVar12 + 1) {
                  dVar13 = *pdVar12;
                  if (dVar13 < 0.0) {
                    dVar13 = sqrt(dVar13);
                  }
                  else {
                    dVar13 = SQRT(dVar13);
                  }
                  *pdVar12 = dVar13;
                }
                QuadTerms::unfold_if_need(local_50);
                local_78.data_ = *(double **)(lVar11 + 0x180);
                local_78.size_ = *(size_t *)(lVar11 + 400);
                local_78.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_78.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_78.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                ArrayRef<int>::move_or_copy
                          ((vector<int,_std::allocator<int>_> *)&local_48,(ArrayRef<int> *)&local_78
                          );
                std::vector<int,_std::allocator<int>_>::_M_move_assign
                          (&__return_storage_ptr__->vars_,&local_48);
                if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_48.super__Vector_base<double,_std::allocator<double>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_48.super__Vector_base<double,_std::allocator<double>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (local_78.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_78.save_.super__Vector_base<double,_std::allocator<double>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_78.save_.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage -
                                  (long)local_78.save_.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start);
                }
                __return_storage_ptr__->const_term = *(double *)(lVar11 + 0x1e0);
                local_78.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)CONCAT44(iVar2,res_var);
                std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                          ((vector<int,std::allocator<int>> *)
                           &__return_storage_ptr__->res_vars_to_delete_,&local_78);
                return __return_storage_ptr__;
              }
              ppVar3 = (this_00->folded_).
                       super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                       .m_data.
                       super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                       .m_data_ptr;
              pdVar12 = (double *)((long)&ppVar3->second + (lVar9 >> 0x1c));
            } while ((0.0 < *pdVar12 || *pdVar12 == 0.0) &&
                    (lVar5 = lVar10 + -4, piVar1 = (int *)((long)&(ppVar3->first).first + lVar10),
                    lVar10 = lVar10 + -0x10, *(int *)((long)ppVar3 + lVar5) == *piVar1));
          }
        }
      }
    }
  }
  __return_storage_ptr__->is_from_abs_ = false;
  (__return_storage_ptr__->coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->const_term = 0.0;
  __return_storage_ptr__->coef_extra = 0.0;
  (__return_storage_ptr__->res_vars_to_delete_).super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->res_vars_to_delete_).super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->res_vars_to_delete_).super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

ConeArgs CheckNorm2_Pow(const ConInfo& ci, int res_var) {
    const auto& con_pow = MC().template
        GetConstraint<PowConstExpConstraint>(ci);
    const auto arg_pow = con_pow.GetArguments()[0];
    if (0.5 == con_pow.GetParameters()[0] &&     // sqrt(arg_pow)
        MC().HasInitExpression(arg_pow)) {
      const auto& ie_pow = MC().GetInitExpression(arg_pow);
      if (MC().template                          // arg_pow := QFC(...)
          IsConInfoType<QuadraticFunctionalConstraint>(ie_pow)) {
        const auto& con_qdc = MC().template
            GetConstraint<QuadraticFunctionalConstraint>(ie_pow);
        const auto& args_qdc = con_qdc.GetArguments();
        // Allowing a nonneg constant term by adding
        // an auxiliary variable^2
        if (0.0 <= args_qdc.constant_term() &&
            args_qdc.GetBody().GetLinTerms().empty()) {
          const auto& qpterms = args_qdc.GetBody().GetQPTerms();
          for (auto i=qpterms.size(); i--; ) {
            if (qpterms.coef(i) < 0.0 ||
                qpterms.var1(i) != qpterms.var2(i))
              return {};
          }
          ConeArgs result;
          result.coefs_ = qpterms.coefs();
          for (auto& c: result.coefs_)
            c = std::sqrt(c);
          result.vars_ = qpterms.vars1();
          result.const_term = args_qdc.constant_term();
          result.res_vars_to_delete_ = { res_var, arg_pow };
          return result;
        }
      }
    }
    return {};
  }